

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_base64.cpp
# Opt level: O2

void EncodeBase64Helper3(uchar *inbuf,char *outbuf)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  
  bVar2 = *inbuf;
  bVar1 = bVar2 >> 2;
  if (bVar2 < 0x68) {
    bVar1 = bVar1 + 0x41;
  }
  else if (bVar2 < 0xd0) {
    bVar1 = bVar1 + 0x47;
  }
  else if (bVar2 < 0xf8) {
    bVar1 = bVar1 - 4;
  }
  else {
    bVar1 = bVar2 & 4 | 0x2b;
  }
  *outbuf = bVar1;
  bVar1 = inbuf[1];
  bVar2 = bVar1 >> 4 | (bVar2 & 3) << 4;
  if (bVar2 < 0x1a) {
    bVar2 = bVar2 + 0x41;
  }
  else if (bVar2 < 0x34) {
    bVar2 = bVar2 + 0x47;
  }
  else if (bVar2 < 0x3e) {
    bVar2 = bVar2 - 4;
  }
  else {
    bVar2 = (bVar1 & 0x10) >> 2 | 0x2b;
  }
  outbuf[1] = bVar2;
  bVar2 = inbuf[2];
  bVar3 = bVar2 >> 6 | bVar1 << 2 & 0x3f;
  if (bVar3 < 0x1a) {
    bVar3 = bVar3 + 0x41;
  }
  else if ((bVar1 << 2 & 0x3c) < 0x34) {
    bVar3 = bVar3 + 0x47;
  }
  else if (bVar3 < 0x3e) {
    bVar3 = bVar3 - 4;
  }
  else {
    bVar3 = bVar2 >> 4 | 0x2b;
  }
  outbuf[2] = bVar3;
  bVar1 = bVar2 & 0x3f;
  if (bVar1 < 0x1a) {
    bVar1 = bVar1 + 0x41;
  }
  else if (bVar1 < 0x34) {
    bVar1 = bVar1 + 0x47;
  }
  else if (bVar1 < 0x3e) {
    bVar1 = bVar1 - 4;
  }
  else {
    bVar1 = (bVar2 & 1) << 2 | 0x2b;
  }
  outbuf[3] = bVar1;
  return;
}

Assistant:

static void EncodeBase64Helper3(const unsigned char* inbuf, char* outbuf )
{
  // base64 encode 3 bytes from inbuf into 4 bytes of outbuf.
  unsigned char b, c;
  
  b = *inbuf++;
  c = (b >> 2);

  if ( c < 26 ) c += 65; else if ( c < 52 ) c += 71; 
  else if ( c < 62 ) c -= 4; else c = (c&1) ? '/' : '+';
  *outbuf++ = c;

  c = (b & 3) << 4;
  b = *inbuf++;
  c |= (b & 0xF0) >> 4;

  if ( c < 26 ) c += 65; else if ( c < 52 ) c += 71; 
  else if ( c < 62 ) c -= 4; else c = (c&1) ? '/' : '+';
  *outbuf++ = c;

  c = (b & 0x0F) << 2;
  b = *inbuf++;
  c |= (b&0xC0) >> 6;

  if ( c < 26 ) c += 65; else if ( c < 52 ) c += 71; 
  else if ( c < 62 ) c -= 4; else c = (c&1) ? '/' : '+';
  *outbuf++ = c;

  b &= 0x3F;
  if ( b < 26 ) b += 65; else if ( b < 52 ) b += 71; 
  else if ( b < 62 ) b -= 4; else b = (b&1) ? '/' : '+';
  *outbuf++ = b;
}